

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ggwave_ProtocolId gVar6;
  ggwave_Parameters *pgVar7;
  long *plVar8;
  void *pvVar9;
  Protocols *pPVar10;
  undefined8 *puVar11;
  _Rb_tree_node_base *p_Var12;
  undefined8 extraout_RAX;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  string payload_1;
  TxRxData result;
  string payload;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  anon_class_8_1_4eff857e addNoiseHelper;
  anon_class_8_1_4eff857e convertHelper;
  GGWave instance;
  _Base_ptr local_680;
  ggwave_Parameters local_678;
  long local_648;
  undefined4 local_640;
  undefined1 *local_638;
  uint local_630;
  undefined1 local_628 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_618;
  anon_class_8_1_4eff857e local_600;
  anon_class_8_1_4eff857e local_5f8;
  Protocol *local_5f0;
  GGWave local_5e8 [1464];
  
  bVar17 = true;
  if (1 < argc) {
    iVar3 = strcmp(argv[1],"--full");
    bVar17 = iVar3 != 0;
  }
  local_600.buffer = &local_618;
  local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8.buffer = local_600.buffer;
  pgVar7 = (ggwave_Parameters *)GGWave::getDefaultParameters();
  GGWave::GGWave(local_5e8,pgVar7);
  local_678._0_8_ = &local_678.samplesPerFrame;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"hello","");
  cVar2 = GGWave::init((char *)local_5e8,local_678.payloadLength,1);
  if (cVar2 == '\0') goto LAB_00104431;
  cVar2 = GGWave::init((int)local_5e8,(char *)0xffffffff,0x1081bf,1);
  if (cVar2 != '\0') goto LAB_00104436;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x0,GGWAVE_PROTOCOL_AUDIBLE_NORMAL,1);
  if (cVar2 == '\0') goto LAB_0010443b;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x0,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_00104440;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x1,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_00104445;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x2,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_0010444a;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x3,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_0010444f;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_678._8_8_ & 0xffffffff),local_678.payloadLength
                       ,1);
  if (cVar2 != '\0') goto LAB_00104454;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_678._8_8_ & 0xffffffff),local_678.payloadLength
                       ,1);
  if (cVar2 == '\0') goto LAB_00104459;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_678._8_8_ & 0xffffffff),local_678.payloadLength
                       ,1);
  if (cVar2 == '\0') goto LAB_0010445e;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_678._8_8_ & 0xffffffff),local_678.payloadLength
                       ,1);
  if (cVar2 != '\0') {
    cVar2 = GGWave::init((int)local_5e8,(char *)(local_678._8_8_ & 0xffffffff),
                         local_678.payloadLength,1);
    if (cVar2 != '\0') goto LAB_00104468;
    if ((int *)local_678._0_8_ != &local_678.samplesPerFrame) {
      operator_delete((void *)local_678._0_8_);
    }
    GGWave::~GGWave(local_5e8);
    uVar15 = 8000;
    local_680._0_4_ = 8000.0;
    while( true ) {
      uVar14 = (uint)uVar15;
      printf("Testing: sample rate = %d\n",uVar15);
      plVar8 = (long *)GGWave::getDefaultParameters();
      local_678._0_8_ = *plVar8;
      local_678.sampleRateOut = *(float *)(plVar8 + 1);
      local_678.sampleRate = *(float *)((long)plVar8 + 0xc);
      local_678._24_8_ = plVar8[3];
      local_678.operatingMode = *(int *)(plVar8 + 4);
      local_678.soundMarkerThreshold = 3.0;
      local_678.samplesPerFrame = (int)plVar8[2];
      local_638 = local_628;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"hello123","");
      local_678.sampleRateOut = local_680._0_4_;
      GGWave::GGWave(local_5e8,&local_678);
      GGWave::init((char *)local_5e8,(ggwave_ProtocolId)local_638,8);
      uVar4 = GGWave::encodeSize_bytes();
      uVar5 = GGWave::encode();
      printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
      if (uVar4 < uVar5) break;
      pvVar9 = (void *)GGWave::txWaveform();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_618,(ulong)uVar5);
      memcpy(local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pvVar9,(ulong)uVar5);
      main::anon_class_8_1_4eff857e::operator()(&local_600,0.01,local_678.sampleFormatOut);
      main::anon_class_8_1_4eff857e::operator()
                (&local_5f8,local_678.sampleFormatOut,local_678.sampleFormatInp);
      GGWave::~GGWave(local_5e8);
      local_678.sampleRateInp = local_680._0_4_;
      GGWave::GGWave(local_5e8,&local_678);
      gVar6 = GGWave::rxProtocols();
      GGWave::Protocols::only(gVar6);
      GGWave::decode(local_5e8,
                     (uint)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
      local_648 = 0;
      local_640 = 0;
      uVar4 = GGWave::rxTakeData((ggvector *)local_5e8);
      if (uVar4 != local_630) goto LAB_0010442c;
      if (0 < (int)local_630) {
        uVar15 = 0;
        do {
          if ((int)(char)local_638[uVar15] != (uint)*(byte *)(local_648 + uVar15))
          goto LAB_00104422;
          uVar15 = uVar15 + 1;
        } while ((local_630 & 0x7fffffff) != uVar15);
      }
      GGWave::~GGWave(local_5e8);
      if (local_638 != local_628) {
        operator_delete(local_638);
      }
      uVar4 = uVar14 + 0x55b;
      local_680._0_4_ = (float)(int)uVar4;
      uVar15 = (ulong)uVar4;
      if (0x171a5 < uVar14) {
        local_638 = local_628;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"a0Z5kR2g","");
        local_680 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            &kFormats._M_t._M_impl.super__Rb_tree_header) {
          p_Var12 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            for (; (_Rb_tree_header *)p_Var12 != &kFormats._M_t._M_impl.super__Rb_tree_header;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
              if ((!bVar17) || ((local_680[1]._M_color == 4 && (p_Var12[1]._M_color == 5)))) {
                lVar16 = 0;
                do {
                  pPVar10 = GGWave::Protocols::kDefault();
                  if (pPVar10->data[lVar16].enabled != false) {
                    local_5f0 = pPVar10->data + lVar16;
                    printf("Testing: protocol = %s, in = %d, out = %d\n",local_5f0->name,
                           (ulong)p_Var12[1]._M_color,(ulong)local_680[1]._M_color);
                    iVar3 = (int)local_5e8;
                    if ((0 < (int)local_630) && (local_5f0->extra != '\x02')) {
                      uVar15 = 1;
                      do {
                        plVar8 = (long *)GGWave::getDefaultParameters();
                        local_678.operatingMode = *(int *)(plVar8 + 4);
                        local_678._0_8_ = *plVar8;
                        local_678._8_8_ = plVar8[1];
                        local_678._16_8_ = plVar8[2];
                        local_678.sampleFormatOut = local_680[1]._M_color;
                        local_678.sampleFormatInp = p_Var12[1]._M_color;
                        GGWave::GGWave(local_5e8,&local_678);
                        gVar6 = GGWave::rxProtocols();
                        GGWave::Protocols::only(gVar6);
                        GGWave::init(iVar3,(char *)(uVar15 & 0xffffffff),
                                     (ggwave_ProtocolId)local_638,(int)lVar16);
                        uVar4 = GGWave::encodeSize_bytes();
                        uVar5 = GGWave::encode();
                        printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
                        if (uVar4 != uVar5) goto LAB_00104418;
                        pvVar9 = (void *)GGWave::txWaveform();
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_618,(ulong)uVar5);
                        memcpy(local_618.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,pvVar9,(ulong)uVar5);
                        main::anon_class_8_1_4eff857e::operator()
                                  (&local_600,0.02,local_678.sampleFormatOut);
                        main::anon_class_8_1_4eff857e::operator()
                                  (&local_5f8,local_680[1]._M_color,p_Var12[1]._M_color);
                        GGWave::decode(local_5e8,
                                       (uint)local_618.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                        local_648 = 0;
                        local_640 = 0;
                        uVar4 = GGWave::rxTakeData((ggvector *)local_5e8);
                        if (uVar15 != uVar4) goto LAB_0010441d;
                        uVar13 = 0;
                        do {
                          if ((int)(char)local_638[uVar13] != (uint)*(byte *)(local_648 + uVar13))
                          goto LAB_00104409;
                          uVar13 = uVar13 + 1;
                        } while (uVar15 != uVar13);
                        GGWave::~GGWave(local_5e8);
                      } while (((long)uVar15 < (long)(int)local_630) &&
                              (uVar15 = uVar15 + 1, local_5f0->extra != '\x02'));
                    }
                    if (0 < (int)local_630) {
                      uVar15 = 1;
                      do {
                        puVar11 = (undefined8 *)GGWave::getDefaultParameters();
                        local_678._8_8_ = puVar11[1];
                        local_678._16_8_ = puVar11[2];
                        local_678.operatingMode = *(int *)(puVar11 + 4);
                        local_678.sampleRateInp = (float)((ulong)*puVar11 >> 0x20);
                        local_678.payloadLength = (int)uVar15;
                        local_678.sampleFormatOut = local_680[1]._M_color;
                        local_678.sampleFormatInp = p_Var12[1]._M_color;
                        uVar4 = rand();
                        if ((uVar4 & 1) == 0) {
                          local_678.operatingMode = local_678.operatingMode | 0x10;
                        }
                        GGWave::GGWave(local_5e8,&local_678);
                        gVar6 = GGWave::rxProtocols();
                        GGWave::Protocols::only(gVar6);
                        GGWave::init(iVar3,(char *)(uVar15 & 0xffffffff),
                                     (ggwave_ProtocolId)local_638,(int)lVar16);
                        uVar4 = GGWave::encodeSize_bytes();
                        uVar5 = GGWave::encode();
                        printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
                        if (uVar4 != uVar5) goto LAB_0010440e;
                        pvVar9 = (void *)GGWave::txWaveform();
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_618,(ulong)uVar5);
                        memcpy(local_618.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,pvVar9,(ulong)uVar5);
                        main::anon_class_8_1_4eff857e::operator()
                                  (&local_600,0.1,local_678.sampleFormatOut);
                        main::anon_class_8_1_4eff857e::operator()
                                  (&local_5f8,local_680[1]._M_color,p_Var12[1]._M_color);
                        GGWave::decode(local_5e8,
                                       (uint)local_618.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                        local_648 = 0;
                        local_640 = 0;
                        uVar4 = GGWave::rxTakeData((ggvector *)local_5e8);
                        if (uVar15 != uVar4) goto LAB_00104413;
                        uVar13 = 0;
                        do {
                          if ((int)(char)local_638[uVar13] != (uint)*(byte *)(local_648 + uVar13)) {
                            main_cold_17();
LAB_00104409:
                            main_cold_14();
                            goto LAB_0010440e;
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar15 != uVar13);
                        GGWave::~GGWave(local_5e8);
                        bVar1 = (long)uVar15 < (long)(int)local_630;
                        uVar15 = uVar15 + 1;
                      } while (bVar1);
                    }
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 0x16);
              }
            }
            local_680 = (_Base_ptr)std::_Rb_tree_increment(local_680);
            p_Var12 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          } while ((_Rb_tree_header *)local_680 != &kFormats._M_t._M_impl.super__Rb_tree_header);
        }
        if (local_638 != local_628) {
          operator_delete(local_638);
        }
        if (local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_618.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
    }
    goto LAB_00104427;
  }
  goto LAB_00104463;
LAB_0010440e:
  main_cold_15();
LAB_00104413:
  main_cold_16();
LAB_00104418:
  main_cold_12();
LAB_0010441d:
  main_cold_13();
LAB_00104422:
  main_cold_11();
LAB_00104427:
  main_cold_18();
LAB_0010442c:
  main_cold_10();
LAB_00104431:
  main_cold_1();
LAB_00104436:
  main_cold_21();
LAB_0010443b:
  main_cold_2();
LAB_00104440:
  main_cold_3();
LAB_00104445:
  main_cold_4();
LAB_0010444a:
  main_cold_5();
LAB_0010444f:
  main_cold_6();
LAB_00104454:
  main_cold_20();
LAB_00104459:
  main_cold_7();
LAB_0010445e:
  main_cold_8();
LAB_00104463:
  main_cold_9();
LAB_00104468:
  main_cold_19();
  if (local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char ** argv) {
    bool full = false;
    if (argc > 1) {
        if (strcmp(argv[1], "--full") == 0) {
            full = true;
        }
    }

    std::vector<uint8_t> buffer;

    auto convertHelper = [&](GGWave::SampleFormat formatOut, GGWave::SampleFormat formatInp) {
        switch (formatOut) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint8_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<uint8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int8_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<int8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<uint16_t, uint8_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint16_t, int8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint16_t, int16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint16_t, float>  (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int16_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<int16_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int16_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int16_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<float, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<float, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<float, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<float, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       break;
                    };
                } break;
        };
    };

    auto addNoiseHelper = [&](float level, GGWave::SampleFormat format) {
        switch (format) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    const int n = buffer.size()/sizeof(uint8_t);
                    auto p = (uint8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(255.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    const int n = buffer.size()/sizeof(int8_t);
                    auto p = (int8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-128.0f, std::min(127.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    const int n = buffer.size()/sizeof(uint16_t);
                    auto p = (uint16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(65535.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    const int n = buffer.size()/sizeof(int16_t);
                    auto p = (int16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-32768.0f, std::min(32767.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    const int n = buffer.size()/sizeof(float);
                    auto p = (float *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-1.0f, std::min(1.0f, p[i] + (frand() - 0.5f)*(level)));
                    }
                } break;
        };
    };

    {
        GGWave instance(GGWave::getDefaultParameters());

        std::string payload = "hello";

        CHECK(instance.init(payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // data
        CHECK_F(instance.init(-1, "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  nullptr, GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(1,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(2,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(3,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // volume
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, -1));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 0));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 50));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 100));
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 101));
    }

    // playback / capture at different sample rates
    for (int srInp = GGWave::kDefaultSampleRate/6; srInp <= 2*GGWave::kDefaultSampleRate; srInp += 1371) {
        printf("Testing: sample rate = %d\n", srInp);

        auto parameters = GGWave::getDefaultParameters();
        parameters.soundMarkerThreshold = 3.0f;

        const std::string payload = "hello123";

        // encode
        {
            parameters.sampleRateOut = srInp;
            GGWave instanceOut(parameters);

            instanceOut.init(payload.c_str(), GGWAVE_PROTOCOL_DT_FASTEST, 25);
            const auto expectedSize = instanceOut.encodeSize_bytes();
            const auto nBytes = instanceOut.encode();
            printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
            CHECK(expectedSize >= nBytes);
            { auto p = (const uint8_t *)(instanceOut.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
            addNoiseHelper(0.01, parameters.sampleFormatOut); // add some artificial noise
            convertHelper(parameters.sampleFormatOut, parameters.sampleFormatInp);
        }

        // decode
        {
            parameters.sampleRateInp = srInp;
            GGWave instanceInp(parameters);
            instanceInp.rxProtocols().only(GGWAVE_PROTOCOL_DT_FASTEST);

            instanceInp.decode(buffer.data(), buffer.size());

            GGWave::TxRxData result;
            CHECK(instanceInp.rxTakeData(result) == (int) payload.size());
            for (int i = 0; i < (int) payload.size(); ++i) {
                CHECK(payload[i] == result[i]);
            }
        }
    }

    const std::string payload = "a0Z5kR2g";

    // encode / decode using different sample formats and Tx protocols
    for (const auto & formatOut : kFormats) {
        for (const auto & formatInp : kFormats) {
            if (full == false) {
                if (formatOut != GGWAVE_SAMPLE_FORMAT_I16) continue;
                if (formatInp != GGWAVE_SAMPLE_FORMAT_F32) continue;
            }
            for (int protocolId = 0; protocolId < GGWAVE_PROTOCOL_COUNT; ++protocolId) {
                const auto & protocol = GGWave::Protocols::kDefault()[protocolId];
                if (protocol.enabled == false) continue;
                printf("Testing: protocol = %s, in = %d, out = %d\n", protocol.name, formatInp, formatOut);

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // mono-tone protocols with variable length are not supported
                    if (protocol.extra == 2) {
                        break;
                    }

                    // variable payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        // it seems DSS is not suitable for "variable-length" transmission
                        // sometimes, the decoder incorrectly detects an early "end" marker when DSS is enabled
                        //if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 25);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.02, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // fixed payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.payloadLength = length;
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 10);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.10, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }
            }
        }
    }

    return 0;
}